

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WhereBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_wherebroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x532) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x532;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    WhereBroadcastableLayerParams::WhereBroadcastableLayerParams(this_00.wherebroadcastable_);
    (this->layer_).wherebroadcastable_ = (WhereBroadcastableLayerParams *)this_00;
  }
  return (WhereBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::WhereBroadcastableLayerParams* NeuralNetworkLayer::mutable_wherebroadcastable() {
  if (!has_wherebroadcastable()) {
    clear_layer();
    set_has_wherebroadcastable();
    layer_.wherebroadcastable_ = new ::CoreML::Specification::WhereBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.whereBroadcastable)
  return layer_.wherebroadcastable_;
}